

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
checkOptionValue(HighsLogOptions *report_log_options,OptionRecordDouble *option,double value)

{
  undefined8 uVar1;
  long in_RSI;
  char *in_RDI;
  HighsLogOptions *in_XMM0_Qa;
  OptionStatus local_4;
  
  if (*(double *)(in_RSI + 0x60) <= (double)in_XMM0_Qa) {
    if ((double)in_XMM0_Qa < *(double *)(in_RSI + 0x68) ||
        (double)in_XMM0_Qa == *(double *)(in_RSI + 0x68)) {
      local_4 = kOk;
    }
    else {
      uVar1 = std::__cxx11::string::c_str();
      highsLogUser(in_XMM0_Qa,*(HighsLogType *)(in_RSI + 0x68),in_RDI,4,
                   "checkOptionValue: Value %g for option \"%s\" is above upper bound of %g\n",uVar1
                  );
      local_4 = kIllegalValue;
    }
  }
  else {
    uVar1 = std::__cxx11::string::c_str();
    highsLogUser(in_XMM0_Qa,*(HighsLogType *)(in_RSI + 0x60),in_RDI,4,
                 "checkOptionValue: Value %g for option \"%s\" is below lower bound of %g\n",uVar1);
    local_4 = kIllegalValue;
  }
  return local_4;
}

Assistant:

OptionStatus checkOptionValue(const HighsLogOptions& report_log_options,
                              OptionRecordDouble& option, const double value) {
  if (value < option.lower_bound) {
    highsLogUser(report_log_options, HighsLogType::kWarning,
                 "checkOptionValue: Value %g for option \"%s\" is below "
                 "lower bound of %g\n",
                 value, option.name.c_str(), option.lower_bound);
    return OptionStatus::kIllegalValue;
  } else if (value > option.upper_bound) {
    highsLogUser(report_log_options, HighsLogType::kWarning,
                 "checkOptionValue: Value %g for option \"%s\" is above "
                 "upper bound of %g\n",
                 value, option.name.c_str(), option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  return OptionStatus::kOk;
}